

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExact.c
# Opt level: O2

int cuddExact(DdManager *table,int lower,int upper)

{
  DdNode **ppDVar1;
  byte *pbVar2;
  long lVar3;
  DdHalfWord DVar4;
  DdNode **ppDVar5;
  DdNode *pDVar6;
  DdHalfWord *permutation;
  DdHalfWord **ppDVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint *puVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  DdHalfWord DVar15;
  long lVar16;
  long lVar17;
  DdHalfWord *pDVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  DdNode *sentinel;
  int roots;
  long lVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  DdManager *pDVar32;
  int *piVar33;
  DdManager *pDVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  int upper_00;
  ulong uVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  uint local_104;
  DdHalfWord *local_100;
  uint *local_f8;
  int local_e4;
  DdHalfWord **local_e0;
  void *local_d8;
  void *local_d0;
  DdHalfWord **local_b8;
  uint *local_b0;
  
  uVar38 = (ulong)lower;
  uVar42 = (ulong)upper;
  lVar36 = uVar38 * 0xe + 4;
  lVar23 = uVar38 * 0xe + 7;
  while (((table->subtables[uVar38].keys == 1 && ((long)uVar38 < (long)uVar42)) &&
         (table->vars[table->invperm[uVar38]]->ref == 1))) {
    uVar38 = uVar38 + 1;
    lVar36 = lVar36 + 0xe;
    lVar23 = lVar23 + 0xe;
  }
  iVar10 = (int)uVar38;
  lVar40 = (long)iVar10;
  lVar27 = uVar42 << 0x20;
  puVar11 = &table->subtables[uVar42].keys;
  while (((*puVar11 == 1 && (lVar40 < (long)uVar42)) &&
         (table->vars[table->invperm[uVar42]]->ref == 1))) {
    uVar42 = uVar42 - 1;
    lVar27 = lVar27 + -0x100000000;
    puVar11 = puVar11 + -0xe;
  }
  if (uVar38 == uVar42) {
LAB_006146c0:
    iVar10 = 1;
  }
  else {
    upper_00 = (int)uVar42;
    iVar8 = cuddSymmSiftingConv(table,iVar10,upper_00);
    iVar24 = 0;
    if (iVar8 != 0) {
      iVar28 = upper_00 + 1;
      iVar29 = iVar28 - iVar10;
      iVar8 = table->size;
      uVar12 = uVar38;
LAB_0061471d:
      lVar16 = uVar12 * 0xe + 0x12;
LAB_00614725:
      uVar12 = uVar12 + 1;
      if ((long)uVar12 < lVar27 >> 0x20) goto code_r0x0061472d;
      uVar9 = (upper_00 - (iVar24 + iVar10)) + 1;
      if (0x21 < uVar9) goto LAB_00614906;
      if (uVar9 < 2) {
        iVar24 = 1;
      }
      else {
        uVar14 = (upper_00 - (iVar24 + iVar10)) + 4U >> 1;
        dVar43 = (double)uVar14;
        dVar45 = 2.0;
        for (dVar44 = (double)(int)(uVar14 + 1); dVar44 <= (double)(int)uVar9; dVar44 = dVar44 + 1.0
            ) {
          dVar43 = (dVar43 * dVar44) / dVar45;
          dVar45 = dVar45 + 1.0;
        }
        iVar24 = (int)dVar43;
        if (iVar24 == -1) {
LAB_00614906:
          local_d0 = (void *)0x0;
          local_d8 = (void *)0x0;
          local_f8 = (uint *)0x0;
          local_b0 = (uint *)0x0;
          local_100 = (DdHalfWord *)0x0;
          goto LAB_006149c0;
        }
      }
      iVar25 = (upper_00 - iVar10) + 1;
      local_b8 = getMatrix(iVar24,iVar25);
      if (local_b8 == (DdHalfWord **)0x0) goto LAB_00614906;
      local_f8 = (uint *)malloc((long)iVar24 << 2);
      if (local_f8 == (uint *)0x0) {
        local_100 = (DdHalfWord *)0x0;
        local_b0 = (uint *)0x0;
        local_f8 = (uint *)0x0;
        local_e0 = (DdHalfWord **)0x0;
        local_d8 = (void *)0x0;
        local_d0 = (void *)0x0;
LAB_0061499a:
        freeMatrix(local_b8);
LAB_006149a4:
        if (local_e0 != (DdHalfWord **)0x0) {
          freeMatrix(local_e0);
        }
        goto LAB_006149c0;
      }
      local_e0 = getMatrix(iVar24,iVar25);
      if (local_e0 == (DdHalfWord **)0x0) {
        local_100 = (DdHalfWord *)0x0;
        local_b0 = (uint *)0x0;
        local_e0 = (DdHalfWord **)0x0;
        local_d8 = (void *)0x0;
        local_d0 = (void *)0x0;
        goto LAB_0061499a;
      }
      local_b0 = (uint *)malloc((long)iVar24 << 2);
      if (local_b0 == (uint *)0x0) {
        local_100 = (DdHalfWord *)0x0;
        local_b0 = (uint *)0x0;
LAB_0061497e:
        local_d0 = (void *)0x0;
LAB_00614990:
        local_d8 = (void *)0x0;
        goto LAB_0061499a;
      }
      lVar16 = (long)iVar25;
      local_100 = (DdHalfWord *)malloc(lVar16 * 4);
      if (local_100 == (DdHalfWord *)0x0) {
        local_100 = (DdHalfWord *)0x0;
        goto LAB_0061497e;
      }
      local_d0 = malloc((long)iVar8);
      if (local_d0 == (void *)0x0) goto LAB_0061497e;
      local_d8 = malloc((long)table->size << 2);
      uVar12 = uVar38;
      if (local_d8 == (void *)0x0) goto LAB_00614990;
      for (; (long)uVar12 <= (long)uVar42; uVar12 = uVar12 + 1) {
        *(int *)((long)local_d8 + (long)table->invperm[uVar12] * 4) =
             table->invperm[*(int *)((long)&table->subtables->nodelist + lVar23 * 4)];
        lVar23 = lVar23 + 0xe;
      }
      iVar24 = 0;
      uVar19 = uVar38 & 0xffffffff;
      for (uVar12 = uVar38; (long)uVar12 <= (long)uVar42; uVar12 = uVar12 + 1) {
        ppDVar5 = table->subtables[uVar12].nodelist;
        uVar9 = table->subtables[uVar12].slots;
        if ((int)uVar9 < 1) {
          uVar9 = 0;
        }
        for (uVar30 = 0; uVar30 != uVar9; uVar30 = uVar30 + 1) {
          for (pDVar32 = (DdManager *)ppDVar5[uVar30]; pDVar32 != table;
              pDVar32 = (DdManager *)((ulong)(pDVar32->sentinel).next & 0xfffffffffffffffe)) {
            if (((ulong)(pDVar32->sentinel).next & 1) == 0) {
              iVar24 = iVar24 + (uint)(pDVar32 !=
                                      (DdManager *)table->vars[(pDVar32->sentinel).index]);
            }
            pDVar6 = (pDVar32->sentinel).type.kids.T;
            if (*(int *)((ulong)pDVar6 & 0xfffffffffffffffe) != 0x7fffffff) {
              ppDVar1 = &pDVar6->next;
              *(byte *)ppDVar1 = *(byte *)ppDVar1 | 1;
              if ((int)uVar19 < table->perm[((pDVar32->sentinel).type.kids.T)->index]) {
                uVar19 = (ulong)(uint)table->perm[((pDVar32->sentinel).type.kids.T)->index];
              }
            }
            piVar33 = (int *)((ulong)(pDVar32->sentinel).type.kids.E & 0xfffffffffffffffe);
            if (*piVar33 != 0x7fffffff) {
              pbVar2 = (byte *)(piVar33 + 2);
              *pbVar2 = *pbVar2 | 1;
              if ((int)uVar19 <
                  table->perm
                  [*(uint *)((ulong)(pDVar32->sentinel).type.kids.E & 0xfffffffffffffffe)]) {
                uVar19 = (ulong)(uint)table->perm
                                      [*(uint *)((ulong)(pDVar32->sentinel).type.kids.E &
                                                0xfffffffffffffffe)];
              }
            }
          }
        }
      }
      for (uVar12 = uVar38; (long)uVar12 <= (long)(int)uVar19; uVar12 = uVar12 + 1) {
        ppDVar5 = table->subtables[uVar12].nodelist;
        uVar9 = table->subtables[uVar12].slots;
        if ((int)uVar9 < 1) {
          uVar9 = 0;
        }
        for (uVar30 = 0; uVar30 != uVar9; uVar30 = uVar30 + 1) {
          pDVar32 = (DdManager *)ppDVar5[uVar30];
          while (pDVar32 != table) {
            pDVar34 = (DdManager *)((ulong)(pDVar32->sentinel).next & 0xfffffffffffffffe);
            (pDVar32->sentinel).next = (DdNode *)pDVar34;
            pDVar32 = pDVar34;
          }
        }
      }
      lVar37 = (long)(upper_00 - iVar10);
      for (lVar23 = 0; lVar23 <= lVar37; lVar23 = lVar23 + 1) {
        DVar4 = table->invperm[iVar10 + lVar23];
        local_100[lVar23] = DVar4;
        (*local_e0)[lVar23] = DVar4;
      }
      uVar9 = (table->constants).keys;
      for (; iVar28 < iVar8; iVar28 = iVar28 + 1) {
        iVar25 = getLevelKeys(table,iVar28);
        uVar9 = uVar9 + iVar25;
      }
      *local_b0 = uVar9;
      local_e4 = table->keys - table->isolated;
      iVar8 = 0;
      if (0 < iVar10) {
        iVar8 = iVar10;
      }
      lVar41 = (long)iVar29;
      lVar23 = lVar41 * 4;
      lVar35 = 1;
      local_104 = 1;
      while( true ) {
        lVar41 = lVar41 + -1;
        lVar23 = lVar23 + -4;
        lVar31 = lVar16 - lVar35;
        if (lVar16 < lVar35) break;
        lVar3 = lVar31 + lVar40;
        lVar13 = lVar40 + lVar31 + 1;
        uVar19 = 0;
        uVar12 = (ulong)local_104;
        if ((int)local_104 < 1) {
          uVar12 = uVar19;
        }
        local_104 = 0;
        for (; uVar19 != uVar12; uVar19 = uVar19 + 1) {
          permutation = local_e0[uVar19];
          uVar14 = local_b0[uVar19];
          uVar9 = uVar14;
          for (iVar28 = 0; iVar8 != iVar28; iVar28 = iVar28 + 1) {
            iVar29 = getLevelKeys(table,iVar28);
            uVar9 = uVar9 + iVar29;
          }
          iVar28 = 0;
          lVar20 = lVar36;
          for (lVar17 = 0; (long)(lVar17 + uVar38) <= lVar3; lVar17 = lVar17 + 1) {
            uVar26 = 1;
            if (*(uint *)((long)&table->subtables->nodelist + lVar20 * 4) < 2) {
              uVar26 = (uint)(1 < table->vars[permutation[lVar17]]->ref);
            }
            iVar28 = iVar28 + uVar26;
            lVar20 = lVar20 + 0xe;
          }
          iVar29 = 0;
          if (lVar13 < table->size) {
            if (lVar3 < lVar27 >> 0x20) {
              uVar30 = (ulong)permutation[lVar31 + 1];
            }
            else {
              uVar30 = (ulong)table->invperm[uVar42 + 1];
            }
            iVar29 = (((table->vars[uVar30]->ref < 2) - 1) - iVar24) + table->subtables[lVar13].keys
            ;
          }
          if (iVar29 < iVar28) {
            iVar29 = iVar28;
          }
          if ((int)(iVar29 + uVar9) < local_e4) {
            iVar28 = ddShuffle(table,permutation,iVar10,upper_00);
            if (iVar28 != 0) {
              local_e4 = updateUB(table,local_e4,local_100,iVar10,upper_00);
              lVar20 = (long)(int)lVar41;
LAB_00614ddc:
              lVar17 = lVar20;
              if (-1 < lVar17) {
                iVar28 = iVar10 + -1 + (int)lVar17;
                if ((table->subtables[iVar28].keys == 1) &&
                   (table->vars[table->invperm[iVar28]]->ref == 1)) {
                  lVar20 = lVar17 + -1;
                }
                else {
                  iVar28 = getLevelKeys(table,(int)lVar3);
                  for (uVar30 = uVar38; lVar20 = lVar31, (long)uVar30 <= (long)uVar42;
                      uVar30 = uVar30 + 1) {
                    *(undefined1 *)((long)local_d0 + (long)table->invperm[uVar30]) = 0;
                  }
                  for (; lVar20 <= lVar37; lVar20 = lVar20 + 1) {
                    *(undefined1 *)((long)local_d0 + (ulong)permutation[lVar20]) = 1;
                  }
                  uVar9 = iVar28 + uVar14;
                  uVar30 = 0;
                  if (0 < (int)local_104) {
                    uVar30 = (ulong)local_104;
                  }
                  for (uVar21 = 0; uVar22 = uVar30, uVar21 != uVar30; uVar21 = uVar21 + 1) {
                    lVar20 = 0;
                    while ((lVar41 + lVar20 <= lVar37 &&
                           (*(char *)((long)local_d0 +
                                     (ulong)*(uint *)((long)local_b8[uVar21] + lVar20 * 4 + lVar23))
                            != '\0'))) {
                      lVar20 = lVar20 + 1;
                    }
                    if ((int)lVar35 == (int)lVar20) {
                      uVar30 = uVar21 & 0xffffffff;
                      uVar22 = uVar21;
                      break;
                    }
                  }
                  if (((uint)uVar22 == local_104) || ((int)uVar9 < (int)local_f8[uVar30])) {
                    for (lVar20 = 0; lVar20 <= lVar37; lVar20 = lVar20 + 1) {
                      local_b8[uVar30][lVar20] = permutation[lVar20];
                    }
                    local_f8[uVar30] = uVar9;
                    local_104 = local_104 + ((uint)uVar22 == local_104);
                  }
                  if (lVar17 == 0) goto LAB_00614ff7;
                  DVar4 = permutation[lVar17 + -1];
                  DVar15 = DVar4;
LAB_00614f49:
                  DVar15 = *(DdHalfWord *)((long)local_d8 + (long)(int)DVar15 * 4);
                  lVar20 = lVar17 + -1;
                  if (DVar15 != DVar4) goto code_r0x00614f53;
                  pDVar18 = permutation + lVar17;
                  for (lVar39 = (lVar17 << 0x20) + -0x100000000; lVar39 >> 0x20 < lVar31;
                      lVar39 = lVar39 + 0x100000000) {
                    pDVar18[-1] = *pDVar18;
                    pDVar18 = pDVar18 + 1;
                  }
                  permutation[lVar31] = DVar4;
                  iVar28 = ddShuffle(table,permutation,iVar10,upper_00);
                  if (iVar28 == 0) goto LAB_006150ae;
                  local_e4 = updateUB(table,local_e4,local_100,iVar10,upper_00);
                }
                goto LAB_00614ddc;
              }
              goto LAB_00614ff7;
            }
LAB_006150ae:
            if (local_b8 != (DdHalfWord **)0x0) goto LAB_0061499a;
            goto LAB_006149a4;
          }
LAB_00614ff7:
        }
        lVar35 = lVar35 + 1;
        ppDVar7 = local_e0;
        local_e0 = local_b8;
        puVar11 = local_b0;
        local_b0 = local_f8;
        local_f8 = puVar11;
        local_b8 = ppDVar7;
      }
      iVar10 = ddShuffle(table,local_100,iVar10,upper_00);
      if (iVar10 == 0) goto LAB_006150ae;
      freeMatrix(local_b8);
      freeMatrix(local_e0);
      free(local_100);
      free(local_b0);
      free(local_f8);
      free(local_d8);
      free(local_d0);
      goto LAB_006146c0;
    }
    local_d8 = (void *)0x0;
    local_f8 = (uint *)0x0;
    local_b0 = (uint *)0x0;
    local_100 = (DdHalfWord *)0x0;
    local_d0 = (void *)0x0;
LAB_006149c0:
    free(local_100);
    free(local_b0);
    free(local_f8);
    free(local_d8);
    free(local_d0);
    table->errorCode = CUDD_MEMORY_OUT;
    iVar10 = 0;
  }
  return iVar10;
code_r0x0061472d:
  lVar37 = lVar16 * 4;
  lVar16 = lVar16 + 0xe;
  if (*(int *)((long)&table->subtables->nodelist + lVar37) == 1) goto code_r0x0061473e;
  goto LAB_00614725;
code_r0x0061473e:
  iVar24 = iVar24 + (uint)(table->vars[table->invperm[uVar12]]->ref == 1);
  goto LAB_0061471d;
code_r0x00614f53:
  if (((int)DVar15 <= (int)DVar4) || (lVar31 < table->perm[(int)DVar15])) goto LAB_00614f49;
  goto LAB_00614ddc;
}

Assistant:

int
cuddExact(
  DdManager * table,
  int  lower,
  int  upper)
{
    int k, i, j;
    int maxBinomial, oldSubsets, newSubsets;
    int subsetCost;
    int size;                   /* number of variables to be reordered */
    int unused, nvars, level, result;
    int upperBound, lowerBound, cost;
    int roots;
    char *mask = NULL;
    DdHalfWord  *symmInfo = NULL;
    DdHalfWord **newOrder = NULL;
    DdHalfWord **oldOrder = NULL;
    int *newCost = NULL;
    int *oldCost = NULL;
    DdHalfWord **tmpOrder;
    int *tmpCost;
    DdHalfWord *bestOrder = NULL;
    DdHalfWord *order;
#ifdef DD_STATS
    int  ddTotalSubsets;
#endif

    /* Restrict the range to be reordered by excluding unused variables
    ** at the two ends. */
    while (table->subtables[lower].keys == 1 &&
           table->vars[table->invperm[lower]]->ref == 1 &&
           lower < upper)
        lower++;
    while (table->subtables[upper].keys == 1 &&
           table->vars[table->invperm[upper]]->ref == 1 &&
           lower < upper)
        upper--;
    if (lower == upper) return(1); /* trivial problem */

    /* Apply symmetric sifting to get a good upper bound and to extract
    ** symmetry information. */
    result = cuddSymmSiftingConv(table,lower,upper);
    if (result == 0) goto cuddExactOutOfMem;

#ifdef DD_STATS
    (void) fprintf(table->out,"\n");
    ddTotalShuffles = 0;
    ddTotalSubsets = 0;
#endif

    /* Initialization. */
    nvars = table->size;
    size = upper - lower + 1;
    /* Count unused variable among those to be reordered.  This is only
    ** used to compute maxBinomial. */
    unused = 0;
    for (i = lower + 1; i < upper; i++) {
        if (table->subtables[i].keys == 1 &&
            table->vars[table->invperm[i]]->ref == 1)
            unused++;
    }

    /* Find the maximum number of subsets we may have to store. */
    maxBinomial = getMaxBinomial(size - unused);
    if (maxBinomial == -1) goto cuddExactOutOfMem;

    newOrder = getMatrix(maxBinomial, size);
    if (newOrder == NULL) goto cuddExactOutOfMem;

    newCost = ABC_ALLOC(int, maxBinomial);
    if (newCost == NULL) goto cuddExactOutOfMem;

    oldOrder = getMatrix(maxBinomial, size);
    if (oldOrder == NULL) goto cuddExactOutOfMem;

    oldCost = ABC_ALLOC(int, maxBinomial);
    if (oldCost == NULL) goto cuddExactOutOfMem;

    bestOrder = ABC_ALLOC(DdHalfWord, size);
    if (bestOrder == NULL) goto cuddExactOutOfMem;

    mask = ABC_ALLOC(char, nvars);
    if (mask == NULL) goto cuddExactOutOfMem;

    symmInfo = initSymmInfo(table, lower, upper);
    if (symmInfo == NULL) goto cuddExactOutOfMem;

    roots = ddCountRoots(table, lower, upper);

    /* Initialize the old order matrix for the empty subset and the best
    ** order to the current order. The cost for the empty subset includes
    ** the cost of the levels between upper and the constants. These levels
    ** are not going to change. Hence, we count them only once.
    */
    oldSubsets = 1;
    for (i = 0; i < size; i++) {
        oldOrder[0][i] = bestOrder[i] = (DdHalfWord) table->invperm[i+lower];
    }
    subsetCost = table->constants.keys;
    for (i = upper + 1; i < nvars; i++)
        subsetCost += getLevelKeys(table,i);
    oldCost[0] = subsetCost;
    /* The upper bound is initialized to the current size of the BDDs. */
    upperBound = table->keys - table->isolated;

    /* Now consider subsets of increasing size. */
    for (k = 1; k <= size; k++) {
#ifdef DD_STATS
        (void) fprintf(table->out,"Processing subsets of size %d\n", k);
        fflush(table->out);
#endif
        newSubsets = 0;
        level = size - k;               /* offset of first bottom variable */

        for (i = 0; i < oldSubsets; i++) { /* for each subset of size k-1 */
            order = oldOrder[i];
            cost = oldCost[i];
            lowerBound = computeLB(table, order, roots, cost, lower, upper,
                                   level);
            if (lowerBound >= upperBound)
                continue;
            /* Impose new order. */
            result = ddShuffle(table, order, lower, upper);
            if (result == 0) goto cuddExactOutOfMem;
            upperBound = updateUB(table,upperBound,bestOrder,lower,upper);
            /* For each top bottom variable. */
            for (j = level; j >= 0; j--) {
                /* Skip unused variables. */
                if (table->subtables[j+lower-1].keys == 1 &&
                    table->vars[table->invperm[j+lower-1]]->ref == 1) continue;
                /* Find cost under this order. */
                subsetCost = cost + getLevelKeys(table, lower + level);
                newSubsets = updateEntry(table, order, level, subsetCost,
                                         newOrder, newCost, newSubsets, mask,
                                         lower, upper);
                if (j == 0)
                    break;
                if (checkSymmInfo(table, symmInfo, order[j-1], level) == 0)
                    continue;
                pushDown(order,j-1,level);
                /* Impose new order. */
                result = ddShuffle(table, order, lower, upper);
                if (result == 0) goto cuddExactOutOfMem;
                upperBound = updateUB(table,upperBound,bestOrder,lower,upper);
            } /* for each bottom variable */
        } /* for each subset of size k */

        /* New orders become old orders in preparation for next iteration. */
        tmpOrder = oldOrder; tmpCost = oldCost;
        oldOrder = newOrder; oldCost = newCost;
        newOrder = tmpOrder; newCost = tmpCost;
#ifdef DD_STATS
        ddTotalSubsets += newSubsets;
#endif
        oldSubsets = newSubsets;
    }
    result = ddShuffle(table, bestOrder, lower, upper);
    if (result == 0) goto cuddExactOutOfMem;
#ifdef DD_STATS
#ifdef DD_VERBOSE
    (void) fprintf(table->out,"\n");
#endif
    (void) fprintf(table->out,"#:S_EXACT   %8d: total subsets\n",
                   ddTotalSubsets);
    (void) fprintf(table->out,"#:H_EXACT   %8d: total shuffles",
                   ddTotalShuffles);
#endif

    freeMatrix(newOrder);
    freeMatrix(oldOrder);
    ABC_FREE(bestOrder);
    ABC_FREE(oldCost);
    ABC_FREE(newCost);
    ABC_FREE(symmInfo);
    ABC_FREE(mask);
    return(1);

cuddExactOutOfMem:

    if (newOrder != NULL) freeMatrix(newOrder);
    if (oldOrder != NULL) freeMatrix(oldOrder);
    if (bestOrder != NULL) ABC_FREE(bestOrder);
    if (oldCost != NULL) ABC_FREE(oldCost);
    if (newCost != NULL) ABC_FREE(newCost);
    if (symmInfo != NULL) ABC_FREE(symmInfo);
    if (mask != NULL) ABC_FREE(mask);
    table->errorCode = CUDD_MEMORY_OUT;
    return(0);

}